

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O2

shared_ptr<MPL::ModelPackageItemInfo> __thiscall
MPL::detail::ModelPackageImpl::findItem(ModelPackageImpl *this,string *identifier)

{
  unique_ptr<JsonMap,_std::default_delete<JsonMap>_> uVar1;
  path *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<MPL::ModelPackageItemInfo> sVar2;
  allocator<char> local_d9;
  unique_ptr<JsonMap,_std::default_delete<JsonMap>_> itemInfoEntry;
  string description;
  string author;
  string local_90;
  string name;
  path path;
  
  getItemInfoEntry((ModelPackageImpl *)&itemInfoEntry,identifier);
  uVar1 = itemInfoEntry;
  if ((__uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>)
      itemInfoEntry._M_t.super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
      super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
      super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>)0x0) {
    (this->m_packagePath)._M_pathname._M_dataplus._M_p = (pointer)0x0;
    (this->m_packagePath)._M_pathname._M_string_length = 0;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&description,"path",(allocator<char> *)&local_90);
    JsonMap::getString(&author,(JsonMap *)
                               uVar1._M_t.
                               super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
                               super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
                               super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl,&description);
    std::filesystem::__cxx11::path::path((path *)&name,&author,auto_format);
    std::filesystem::__cxx11::operator/(&path,(path *)&identifier[2].field_2,(path *)&name);
    std::filesystem::__cxx11::path::~path((path *)&name);
    std::__cxx11::string::~string((string *)&author);
    std::__cxx11::string::~string((string *)&description);
    uVar1 = itemInfoEntry;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&author,"name",(allocator<char> *)&description);
    JsonMap::getString(&name,(JsonMap *)
                             uVar1._M_t.
                             super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
                             super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
                             super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl,&author);
    std::__cxx11::string::~string((string *)&author);
    uVar1 = itemInfoEntry;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&description,"author",(allocator<char> *)&local_90);
    JsonMap::getString(&author,(JsonMap *)
                               uVar1._M_t.
                               super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
                               super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
                               super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl,&description);
    std::__cxx11::string::~string((string *)&description);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"description",&local_d9);
    JsonMap::getString(&description,
                       (JsonMap *)
                       itemInfoEntry._M_t.
                       super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
                       super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
                       super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::
    make_shared<MPL::detail::ModelPackageItemInfoImpl,std::__cxx11::string_const&,std::filesystem::__cxx11::path&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
              (&local_90,in_RDX,&path._M_pathname,&name,&author);
    std::
    make_shared<MPL::ModelPackageItemInfo,std::shared_ptr<MPL::detail::ModelPackageItemInfoImpl>>
              ((shared_ptr<MPL::detail::ModelPackageItemInfoImpl> *)this);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_90._M_string_length);
    std::__cxx11::string::~string((string *)&description);
    std::__cxx11::string::~string((string *)&author);
    std::__cxx11::string::~string((string *)&name);
    std::filesystem::__cxx11::path::~path(&path);
  }
  std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr(&itemInfoEntry);
  sVar2.super___shared_ptr<MPL::ModelPackageItemInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<MPL::ModelPackageItemInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MPL::ModelPackageItemInfo>)
         sVar2.super___shared_ptr<MPL::ModelPackageItemInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ModelPackageItemInfo> ModelPackageImpl::findItem(const std::string& identifier) const
{
    auto itemInfoEntry = getItemInfoEntry(identifier);
    if (itemInfoEntry == nullptr) {
        return nullptr;
    }
    
    auto path = m_packageDataDirPath / itemInfoEntry->getString(kModelPackageItemInfoPathKey);
    auto name = itemInfoEntry->getString(kModelPackageItemInfoNameKey);
    auto author = itemInfoEntry->getString(kModelPackageItemInfoAuthorKey);
    auto description = itemInfoEntry->getString(kModelPackageItemInfoDescriptionKey);
    
    return std::make_shared<ModelPackageItemInfo>(std::make_shared<ModelPackageItemInfoImpl>(identifier, path, name, author, description));
}